

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O3

void addJsonObject(QJsonObject *object,QString *keyPrefix,ProValueMap *map)

{
  qsizetype asize;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QJsonValueConstRef QVar4;
  QJsonValueConstRef QVar5;
  QStringBuilder<const_QString_&,_const_QString_&> local_b0;
  QString local_a0;
  QString local_88;
  QArrayDataPointer<QString> local_68;
  QStringBuilder<const_QString_&,_QLatin1String> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)0x0;
  local_68.ptr = (QString *)0x0;
  local_68.size = 0;
  asize = QJsonObject::size();
  QList<QString>::reserve((QList<QString> *)&local_68,asize);
  lVar1 = QJsonObject::size();
  if (lVar1 * 2 != 0) {
    uVar3 = 1;
    do {
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QVar4._8_8_ = object;
      QVar4.field_0.a = (QJsonArray *)&local_88;
      QJsonValueConstRef::objectKey(QVar4);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      QVar5._8_8_ = object;
      QVar5.field_0.a = (QJsonArray *)&local_50;
      QJsonValueConstRef::concrete(QVar5);
      local_b0.a = keyPrefix;
      local_b0.b = &local_88;
      QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>(&local_a0,&local_b0);
      addJsonValue((QJsonValue *)&local_50,&local_a0,map);
      if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
        }
      }
      QJsonValue::~QJsonValue((QJsonValue *)&local_50);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar2 = uVar3 & 0xfffffffffffffffe;
      uVar3 = ((uint)uVar3 & 1) + uVar2 + 2;
    } while (uVar2 + 2 != lVar1 * 2);
  }
  local_50.b.m_size = 6;
  local_50.b.m_data = "_KEYS_";
  local_50.a = keyPrefix;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>(&local_88,&local_50);
  insertJsonKeyValue(&local_88,(QStringList *)&local_68,map);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addJsonObject(const QJsonObject &object, const QString &keyPrefix, ProValueMap *map)
{
    QStringList keys;
    keys.reserve(object.size());
    for (auto it = object.begin(), end = object.end(); it != end; ++it) {
        const QString key = it.key();
        keys.append(key);
        addJsonValue(it.value(), keyPrefix + key, map);
    }
    insertJsonKeyValue(keyPrefix + QLatin1String("_KEYS_"), keys, map);
}